

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

int enum_min(MetaContainer meta)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  MetaContainer str;
  MetaIterator local_58;
  MetaIterator local_48;
  
  str.str_ptr = meta.str_ptr;
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    str.str_ptr = meta.str_ptr + 1;
  }
  rtosc::Port::MetaIterator::MetaIterator(&local_48,str.str_ptr);
  local_58.title = local_48.title;
  local_58.value = local_48.value;
  iVar2 = 0;
  rtosc::Port::MetaIterator::MetaIterator(&local_48,(char *)0x0);
  pcVar1 = local_48.title;
  if (local_58.title != local_48.title) {
    iVar2 = 0;
    do {
      pcVar5 = local_58.title;
      pcVar4 = strstr(local_58.title,"map ");
      if (pcVar4 != (char *)0x0) {
        iVar2 = atoi(pcVar5 + 4);
      }
      rtosc::Port::MetaIterator::operator++(&local_58);
    } while (local_58.title != pcVar1);
  }
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    meta.str_ptr = meta.str_ptr + 1;
  }
  rtosc::Port::MetaIterator::MetaIterator(&local_48,meta.str_ptr);
  local_58.title = local_48.title;
  local_58.value = local_48.value;
  rtosc::Port::MetaIterator::MetaIterator(&local_48,(char *)0x0);
  pcVar1 = local_58.title;
  while (pcVar1 != local_48.title) {
    local_58.title = pcVar1;
    pcVar5 = strstr(pcVar1,"map ");
    if ((pcVar5 != (char *)0x0) && (iVar3 = atoi(pcVar1 + 4), iVar3 <= iVar2)) {
      iVar2 = iVar3;
    }
    rtosc::Port::MetaIterator::operator++(&local_58);
    pcVar1 = local_58.title;
  }
  return iVar2;
}

Assistant:

static int enum_min(Port::MetaContainer meta)
{
    int min = 0;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            min = atoi(m.title+4);

    for(auto m:meta)
        if(strstr(m.title, "map "))
            min = min>atoi(m.title+4) ? atoi(m.title+4) : min;

    return min;
}